

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

Limit __thiscall
google::protobuf::io::CodedInputStream::PushLimit(CodedInputStream *this,int byte_limit)

{
  Limit LVar1;
  bool bVar2;
  int iVar3;
  Limit old_limit;
  int current_position;
  int byte_limit_local;
  CodedInputStream *this_local;
  
  iVar3 = CurrentPosition(this);
  LVar1 = this->current_limit_;
  bVar2 = false;
  if ((-1 < byte_limit) && (bVar2 = false, byte_limit <= 0x7fffffff - iVar3)) {
    bVar2 = byte_limit < this->current_limit_ - iVar3;
  }
  if (bVar2) {
    this->current_limit_ = iVar3 + byte_limit;
    RecomputeBufferLimits(this);
  }
  return LVar1;
}

Assistant:

CodedInputStream::Limit CodedInputStream::PushLimit(int byte_limit) {
  // Current position relative to the beginning of the stream.
  int current_position = CurrentPosition();

  Limit old_limit = current_limit_;

  // security: byte_limit is possibly evil, so check for negative values
  // and overflow. Also check that the new requested limit is before the
  // previous limit; otherwise we continue to enforce the previous limit.
  if (ABSL_PREDICT_TRUE(byte_limit >= 0 &&
                        byte_limit <= INT_MAX - current_position &&
                        byte_limit < current_limit_ - current_position)) {
    current_limit_ = current_position + byte_limit;
    RecomputeBufferLimits();
  }

  return old_limit;
}